

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  void *__s2;
  sqlite3_int64 *psVar7;
  sqlite3_int64 *psVar8;
  char *pcVar9;
  char *__src;
  void *pvVar10;
  undefined4 in_register_00000084;
  int *pnLoad;
  char *p_00;
  long lVar11;
  int nBlob;
  sqlite3_int64 iChild;
  int local_78;
  int local_74;
  void *local_70;
  int local_68;
  int iHeight;
  char *local_60;
  char *local_58;
  sqlite3_int64 *local_50;
  sqlite3_int64 *local_48;
  Fts3Table *local_40;
  sqlite3_int64 *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  local_78 = nTerm;
  iVar2 = (int)*zNode;
  local_58 = zTerm;
  local_50 = piLeaf;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&iHeight);
    iVar2 = iHeight;
  }
  iHeight = iVar2;
  pcVar9 = zNode + nNode;
  iVar2 = sqlite3Fts3GetVarint(zNode,&iChild);
  iVar3 = sqlite3Fts3GetVarint(zNode + iVar2,&iChild);
  p_00 = zNode + iVar2 + iVar3;
  iVar2 = 0x10b;
  iVar3 = local_78;
  local_60 = pcVar9;
  if (p_00 <= pcVar9) {
    local_70 = (void *)0x0;
    local_68 = 0;
    bVar1 = false;
    psVar8 = piLeaf2;
    psVar7 = local_50;
    local_40 = p;
    while (pcVar9 = local_60, pvVar10 = local_70, p_00 < local_60) {
      if (psVar7 == (sqlite3_int64 *)0x0 && psVar8 == (sqlite3_int64 *)0x0) {
        iVar2 = 0;
        goto LAB_00167218;
      }
      local_74 = 0;
      if (bVar1) {
        if (*p_00 < '\0') {
          uVar4 = sqlite3Fts3GetVarint32(p_00,&local_74);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_74 = (int)*p_00;
        }
        p_00 = p_00 + uVar6;
      }
      local_48 = psVar8;
      if (*p_00 < '\0') {
        uVar4 = sqlite3Fts3GetVarint32(p_00,&nBlob);
        uVar6 = (ulong)uVar4;
        uVar4 = nBlob;
      }
      else {
        uVar6 = 1;
        uVar4 = (int)*p_00;
      }
      pvVar10 = local_70;
      lVar11 = (long)local_74;
      if ((lVar11 < 0) || ((int)uVar4 < 0)) {
LAB_00167209:
        iVar2 = 0x10b;
        iVar3 = local_78;
        goto LAB_00167218;
      }
      __src = p_00 + uVar6;
      p_00 = __src + uVar4;
      if (pcVar9 < p_00) goto LAB_00167209;
      iVar2 = uVar4 + local_74;
      __s2 = local_70;
      local_38 = psVar7;
      if (local_68 < iVar2) {
        local_68 = iVar2 * 2;
        __s2 = sqlite3_realloc(local_70,local_68);
        if (__s2 == (void *)0x0) {
          iVar2 = 7;
          iVar3 = local_78;
          goto LAB_00167218;
        }
      }
      memcpy((void *)(lVar11 + (long)__s2),__src,(ulong)uVar4);
      iVar3 = local_78;
      iVar5 = local_78;
      if (iVar2 < local_78) {
        iVar5 = iVar2;
      }
      local_70 = __s2;
      iVar5 = memcmp(local_58,__s2,(long)iVar5);
      psVar8 = local_48;
      if (local_38 == (sqlite3_int64 *)0x0) {
LAB_001671ba:
        if ((local_48 == (sqlite3_int64 *)0x0) || (-1 < iVar5)) {
          psVar7 = (sqlite3_int64 *)0x0;
        }
        else {
          *local_48 = iChild;
          psVar8 = (sqlite3_int64 *)0x0;
          psVar7 = (sqlite3_int64 *)0x0;
        }
      }
      else if ((iVar5 < 0) || (psVar7 = local_38, iVar3 < iVar2 && iVar5 == 0)) {
        *local_38 = iChild;
        goto LAB_001671ba;
      }
      iChild = iChild + 1;
      bVar1 = true;
    }
    if (psVar7 != (sqlite3_int64 *)0x0) {
      *psVar7 = iChild;
    }
    iVar2 = 0;
    if (psVar8 != (sqlite3_int64 *)0x0) {
      *psVar8 = iChild;
    }
LAB_00167218:
    sqlite3_free(pvVar10);
    p = local_40;
  }
  psVar8 = local_50;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (iHeight < 2) {
    return 0;
  }
  iChild = 0;
  nBlob = 0;
  if ((piLeaf2 != (sqlite3_int64 *)0x0 && local_50 != (sqlite3_int64 *)0x0) &&
     (*local_50 != *piLeaf2)) {
    iVar2 = sqlite3Fts3ReadBlock(p,*local_50,(char **)&iChild,&nBlob,pnLoad);
    if (iVar2 == 0) {
      pnLoad = (int *)(ulong)(uint)nBlob;
      iVar2 = fts3SelectLeaf(p,local_58,iVar3,(char *)iChild,nBlob,psVar8,(sqlite3_int64 *)0x0);
    }
    sqlite3_free((void *)iChild);
    iChild = 0;
    psVar8 = (sqlite3_int64 *)0x0;
    if (iVar2 != 0) goto LAB_00167312;
  }
  iChild = 0;
  psVar7 = psVar8;
  if (psVar8 == (sqlite3_int64 *)0x0) {
    psVar7 = piLeaf2;
  }
  iVar2 = sqlite3Fts3ReadBlock(p,*psVar7,(char **)&iChild,&nBlob,pnLoad);
  if (iVar2 == 0) {
    iVar2 = fts3SelectLeaf(p,local_58,iVar3,(char *)iChild,nBlob,psVar8,piLeaf2);
  }
LAB_00167312:
  sqlite3_free((void *)iChild);
  return iVar2;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}